

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

void __thiscall JSONNode::merge(JSONNode *this,uint num,...)

{
  char in_AL;
  void **ppvVar1;
  uint uVar2;
  undefined8 in_RCX;
  ulong uVar3;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  void **local_e0;
  void *local_c8 [4];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e0 = &args[0].overflow_arg_area;
  uVar2 = 0x10;
  local_c8[2] = (void *)in_RDX;
  local_c8[3] = (void *)in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  while (bVar4 = num != 0, num = num - 1, bVar4) {
    uVar3 = (ulong)uVar2;
    if (uVar3 < 0x29) {
      uVar2 = uVar2 + 8;
      ppvVar1 = (void **)((long)local_c8 + uVar3);
    }
    else {
      ppvVar1 = local_e0;
      local_e0 = local_e0 + 1;
    }
    merge(this,(JSONNode *)*ppvVar1);
  }
  return;
}

Assistant:

void JSONNode::merge(unsigned int, ...) json_nothrow {
#endif
    JSON_CHECK_INTERNAL();
    #ifdef JSON_REF_COUNT
	   va_list args;
	   va_start(args, num);
	   for(unsigned int i = 0; i < num; ++i){
		  merge(va_arg(args, JSONNode*));
	   }
	   va_end(args);
    #endif
}